

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void * RunCPQExperiment(void *threadarg)

{
  int insertedNum_1;
  int mode;
  int i_2;
  int i_1;
  int insertedNum;
  int i;
  uint64_t start;
  int operationsCount;
  uint seed;
  threadData *threadData;
  int in_stack_ffffffffffffff2c;
  CircularPriorityQueue<int> *in_stack_ffffffffffffff30;
  long in_stack_ffffffffffffff38;
  allocator<char> *numOfElement;
  CircularPriorityQueue<int> *this;
  int in_stack_ffffffffffffff4c;
  string *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_88;
  allocator<char> local_81;
  string local_80 [32];
  int local_60;
  undefined8 local_49;
  int local_28;
  int local_24;
  undefined8 local_20;
  int local_18;
  uint local_14 [5];
  
  local_14[0] = 0;
  local_18 = (int)(10000000 / (long)threadsCount);
  local_20 = rdtsc();
  for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
    local_28 = rand_r(local_14);
    local_28 = local_28 % 1000000;
    CircularPriorityQueue<int>::push(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  }
  this = (CircularPriorityQueue<int> *)&local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,in_stack_ffffffffffffff60);
  saveThroughput(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(uint64_t)this,
                 in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)((long)&local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pthread_barrier_wait((pthread_barrier_t *)&barrier);
  local_18 = (int)(5000000 / (long)threadsCount);
  local_20 = rdtsc();
  for (local_60 = 0; local_60 < local_18; local_60 = local_60 + 1) {
    CircularPriorityQueue<int>::pop(this);
  }
  numOfElement = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,in_stack_ffffffffffffff60);
  saveThroughput(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(uint64_t)this,
                 (long)numOfElement);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  pthread_barrier_wait((pthread_barrier_t *)&barrier);
  local_14[0] = 0;
  local_18 = (int)(4000000 / (long)threadsCount);
  local_20 = rdtsc();
  for (local_88 = 0; local_88 < local_18; local_88 = local_88 + 1) {
    in_stack_ffffffffffffff74 = rand_r(local_14);
    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 % 3;
    if (in_stack_ffffffffffffff74 == 0) {
      CircularPriorityQueue<int>::pop(this);
    }
    else {
      in_stack_ffffffffffffff70 = rand_r(local_14);
      in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 % 1000000;
      CircularPriorityQueue<int>::push(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,in_stack_ffffffffffffff60);
  saveThroughput(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(uint64_t)this,
                 (long)numOfElement);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  return (void *)0x0;
}

Assistant:

void *RunCPQExperiment(void *threadarg) {
    struct threadData *threadData;
    threadData = (struct threadData *) threadarg;


    unsigned int seed = 0;
    int operationsCount = INSERT_ELEMENTS / threadsCount;

    uint64_t start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        int insertedNum = rand_r(&seed) % MAX_INSERTED_NUM;
        cpq->push(insertedNum);
    }
    saveThroughput("INSERT", threadData->threadId, start, operationsCount);

    pthread_barrier_wait(&barrier);
    operationsCount = DELETE_ELEMENTS / threadsCount;
    start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        cpq->pop();
    }
    saveThroughput("DELETE", threadData->threadId, start, operationsCount);

    pthread_barrier_wait(&barrier);
    seed = 0;
    operationsCount = RANDOM_ELEMENTS / threadsCount;
    start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        int mode = rand_r(&seed) % 3;
        if (mode == 0) {
            cpq->pop();
        } else {
            int insertedNum = rand_r(&seed) % MAX_INSERTED_NUM;
            cpq->push(insertedNum);
        }
    }
    saveThroughput("RANDOM", threadData->threadId, start, operationsCount);

    return nullptr;
}